

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall
calculator::DivZeroException::DivZeroException(DivZeroException *this,double x,int y)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string __str;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = x;
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_00118880;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_50,vsnprintf,0x148,"%f",SUB84(local_58,0));
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x111999);
  local_78 = &local_68;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_68 = *plVar5;
    lStack_60 = plVar2[3];
  }
  else {
    local_68 = *plVar5;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_a8 = *puVar6;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar6;
    local_b8 = (ulong *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __val = -y;
  if (0 < y) {
    __val = y;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_0010a84f;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_0010a84f;
      }
      if (uVar4 < 10000) goto LAB_0010a84f;
      uVar7 = uVar7 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_0010a84f:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)__len - (char)(y >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)y >> 0x1f) + (long)local_d8),__len,__val);
  uVar7 = 0xf;
  if (local_b8 != &local_a8) {
    uVar7 = local_a8;
  }
  if (uVar7 < (ulong)(local_d0 + local_b0)) {
    uVar7 = 0xf;
    if (local_d8 != local_c8) {
      uVar7 = local_c8[0];
    }
    if ((ulong)(local_d0 + local_b0) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0010a8d7;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
LAB_0010a8d7:
  local_98 = &local_88;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_88 = *plVar2;
    uStack_80 = puVar3[3];
  }
  else {
    local_88 = *plVar2;
    local_98 = (long *)*puVar3;
  }
  local_90 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_98
            );
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DivZeroException(double x, int y) {
        error_msg = "Error: div zero/0 error: " + std::to_string(x) + "/" +
                    std::to_string(y);
    }